

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall SQCompiler::SwitchStatement(SQCompiler *this)

{
  SQUnsignedInteger *pSVar1;
  SQFuncState *pSVar2;
  long lVar3;
  undefined2 uVar4;
  bool bVar5;
  SQInteger SVar6;
  longlong *plVar7;
  SQUnsignedInteger SVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  SQUnsignedInteger SVar12;
  SQScope __oldscope__;
  SQInstruction local_68;
  SQInteger SStack_60;
  SQInstruction local_50;
  SQInteger local_48;
  SQLexer *local_40;
  SQUnsignedInteger local_38;
  
  local_40 = &this->_lex;
  SVar6 = SQLexer::Lex(local_40);
  this->_token = SVar6;
  Expect(this,0x28);
  CommaExpr(this);
  Expect(this,0x29);
  Expect(this,0x7b);
  local_48 = SQFuncState::TopTarget(this->_fs);
  pSVar2 = this->_fs;
  local_38 = (pSVar2->_unresolvedbreaks)._size;
  uVar11 = (pSVar2->_breaktargets)._size;
  uVar10 = (pSVar2->_breaktargets)._allocated;
  if (uVar10 <= uVar11) {
    SVar8 = uVar11 * 2;
    SVar12 = 4;
    if (SVar8 != 0) {
      SVar12 = SVar8;
    }
    plVar7 = (longlong *)sq_vm_realloc((pSVar2->_breaktargets)._vals,uVar10 << 3,SVar12 * 8);
    (pSVar2->_breaktargets)._vals = plVar7;
    (pSVar2->_breaktargets)._allocated = SVar12;
  }
  SVar8 = (pSVar2->_breaktargets)._size;
  (pSVar2->_breaktargets)._size = SVar8 + 1;
  (pSVar2->_breaktargets)._vals[SVar8] = 0;
  uVar11 = 0xffffffffffffffff;
  if (this->_token == 300) {
    bVar5 = true;
    uVar10 = 0xffffffffffffffff;
    do {
      if (!bVar5) {
        local_68._arg1 = 0;
        local_68.op = '\x1c';
        local_68._arg0 = '\0';
        local_68._arg2 = '\0';
        local_68._arg3 = '\0';
        SQFuncState::AddInstruction(this->_fs,&local_68);
        uVar10 = (this->_fs->_instructions)._size - 1;
        SQFuncState::SetInstructionParam(this->_fs,uVar11,1,uVar10 - uVar11);
      }
      SVar6 = SQLexer::Lex(local_40);
      this->_token = SVar6;
      Expression(this);
      Expect(this,0x3a);
      SVar8 = SQFuncState::PopTarget(this->_fs);
      bVar5 = SQFuncState::IsLocal(this->_fs,SVar8);
      if (bVar5) {
        SVar6 = SQFuncState::PushTarget(this->_fs,-1);
        local_68._arg0 = (uchar)SVar6;
        local_68._0_5_ = 0xf00000000;
        uVar4 = local_68._4_2_;
        local_68.op = (char)uVar4;
        local_68._arg0 = (char)((ushort)uVar4 >> 8);
        local_68._arg1 = (int)SVar8;
        local_68._arg2 = (char)local_48;
        local_68._arg3 = '\0';
        SQFuncState::AddInstruction(this->_fs,&local_68);
        local_68._arg0 = (uchar)SVar6;
        local_68._0_5_ = 0x1e00000000;
        local_68 = (SQInstruction)((ulong)local_68._4_2_ << 0x20);
        SQFuncState::AddInstruction(this->_fs,&local_68);
        SQFuncState::PopTarget(this->_fs);
      }
      else {
        local_68._arg0 = (uchar)SVar8;
        local_68._0_5_ = 0xf00000000;
        uVar4 = local_68._4_2_;
        local_68.op = (char)uVar4;
        local_68._arg0 = (char)((ushort)uVar4 >> 8);
        local_68._arg1 = (int)SVar8;
        local_68._arg2 = (char)local_48;
        local_68._arg3 = '\0';
        SQFuncState::AddInstruction(this->_fs,&local_68);
        local_68._arg0 = (uchar)SVar8;
        local_68._0_5_ = 0x1e00000000;
        local_68 = (SQInstruction)((ulong)local_68._4_2_ << 0x20);
        SQFuncState::AddInstruction(this->_fs,&local_68);
      }
      if (uVar10 != 0xffffffffffffffff) {
        SQFuncState::SetInstructionParam
                  (this->_fs,uVar10,1,~uVar10 + (this->_fs->_instructions)._size);
      }
      pSVar2 = this->_fs;
      SVar8 = (pSVar2->_instructions)._size;
      local_68 = (SQInstruction)(this->_scope).outers;
      SStack_60 = (this->_scope).stacksize;
      (this->_scope).outers = pSVar2->_outers;
      SVar6 = SQFuncState::GetStackSize(pSVar2);
      (this->_scope).stacksize = SVar6;
      Statements(this);
      lVar9 = this->_fs->_outers;
      SVar6 = SQFuncState::GetStackSize(this->_fs);
      lVar3 = (this->_scope).stacksize;
      if (SVar6 != lVar3) {
        SQFuncState::SetStackSize(this->_fs,lVar3);
        if (lVar9 != this->_fs->_outers) {
          local_50._arg1 = (SQInt32)(this->_scope).stacksize;
          local_50.op = '<';
          local_50._arg0 = '\0';
          local_50._arg2 = '\0';
          local_50._arg3 = '\0';
          SQFuncState::AddInstruction(this->_fs,&local_50);
        }
      }
      uVar11 = SVar8 - 1;
      (this->_scope).outers = (SQInteger)local_68;
      (this->_scope).stacksize = SStack_60;
      bVar5 = false;
    } while (this->_token == 300);
  }
  if (uVar11 != 0xffffffffffffffff) {
    SQFuncState::SetInstructionParam(this->_fs,uVar11,1,~uVar11 + (this->_fs->_instructions)._size);
  }
  if (this->_token == 0x12d) {
    SVar6 = SQLexer::Lex(local_40);
    this->_token = SVar6;
    Expect(this,0x3a);
    local_68 = (SQInstruction)(this->_scope).outers;
    SStack_60 = (this->_scope).stacksize;
    pSVar2 = this->_fs;
    (this->_scope).outers = pSVar2->_outers;
    SVar6 = SQFuncState::GetStackSize(pSVar2);
    (this->_scope).stacksize = SVar6;
    Statements(this);
    lVar9 = this->_fs->_outers;
    SVar6 = SQFuncState::GetStackSize(this->_fs);
    lVar3 = (this->_scope).stacksize;
    if (SVar6 != lVar3) {
      SQFuncState::SetStackSize(this->_fs,lVar3);
      if (lVar9 != this->_fs->_outers) {
        local_50._arg1 = (SQInt32)(this->_scope).stacksize;
        local_50.op = '<';
        local_50._arg0 = '\0';
        local_50._arg2 = '\0';
        local_50._arg3 = '\0';
        SQFuncState::AddInstruction(this->_fs,&local_50);
      }
    }
    (this->_scope).outers = (SQInteger)local_68;
    (this->_scope).stacksize = SStack_60;
  }
  Expect(this,0x7d);
  SQFuncState::PopTarget(this->_fs);
  lVar9 = (this->_fs->_unresolvedbreaks)._size - local_38;
  if (0 < lVar9) {
    ResolveBreaks(this,this->_fs,lVar9);
  }
  pSVar1 = &(this->_fs->_breaktargets)._size;
  *pSVar1 = *pSVar1 - 1;
  return;
}

Assistant:

void SwitchStatement()
    {
        Lex(); Expect(_SC('(')); CommaExpr(); Expect(_SC(')'));
        Expect(_SC('{'));
        SQInteger expr = _fs->TopTarget();
        bool bfirst = true;
        SQInteger tonextcondjmp = -1;
        SQInteger skipcondjmp = -1;
        SQInteger __nbreaks__ = _fs->_unresolvedbreaks.size();
        _fs->_breaktargets.push_back(0);
        while(_token == TK_CASE) {
            if(!bfirst) {
                _fs->AddInstruction(_OP_JMP, 0, 0);
                skipcondjmp = _fs->GetCurrentPos();
                _fs->SetInstructionParam(tonextcondjmp, 1, _fs->GetCurrentPos() - tonextcondjmp);
            }
            //condition
            Lex(); Expression(); Expect(_SC(':'));
            SQInteger trg = _fs->PopTarget();
            SQInteger eqtarget = trg;
            bool local = _fs->IsLocal(trg);
            if(local) {
                eqtarget = _fs->PushTarget(); //we need to allocate a extra reg
            }
            _fs->AddInstruction(_OP_EQ, eqtarget, trg, expr);
            _fs->AddInstruction(_OP_JZ, eqtarget, 0);
            if(local) {
                _fs->PopTarget();
            }

            //end condition
            if(skipcondjmp != -1) {
                _fs->SetInstructionParam(skipcondjmp, 1, (_fs->GetCurrentPos() - skipcondjmp));
            }
            tonextcondjmp = _fs->GetCurrentPos();
            BEGIN_SCOPE();
            Statements();
            END_SCOPE();
            bfirst = false;
        }
        if(tonextcondjmp != -1)
            _fs->SetInstructionParam(tonextcondjmp, 1, _fs->GetCurrentPos() - tonextcondjmp);
        if(_token == TK_DEFAULT) {
            Lex(); Expect(_SC(':'));
            BEGIN_SCOPE();
            Statements();
            END_SCOPE();
        }
        Expect(_SC('}'));
        _fs->PopTarget();
        __nbreaks__ = _fs->_unresolvedbreaks.size() - __nbreaks__;
        if(__nbreaks__ > 0)ResolveBreaks(_fs, __nbreaks__);
        _fs->_breaktargets.pop_back();
    }